

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

string * __thiscall
cmCTestGIT::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  undefined1 local_f8 [8];
  OutputLogger err;
  undefined1 local_a8 [8];
  OneLineParser out;
  char *local_58;
  char *git_rev_list [7];
  char *git;
  cmCTestGIT *this_local;
  string *rev;
  
  local_58 = (char *)std::__cxx11::string::c_str();
  git_rev_list[0] = "rev-list";
  git_rev_list[1] = "-n";
  git_rev_list[2] = "1";
  git_rev_list[3] = "HEAD";
  git_rev_list[4] = "--";
  git_rev_list[5] = (char *)0x0;
  out.Line1._7_1_ = 0;
  git_rev_list[6] = local_58;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  OneLineParser::OneLineParser((OneLineParser *)local_a8,this,"rl-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_f8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rl-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_58,(OutputParser *)local_a8,(OutputParser *)local_f8,
                      (char *)0x0,Auto);
  out.Line1._7_1_ = 1;
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_f8);
  OneLineParser::~OneLineParser((OneLineParser *)local_a8);
  if ((out.Line1._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::GetWorkingRevision()
{
  // Run plumbing "git rev-list" to get work tree revision.
  const char* git = this->CommandLineTool.c_str();
  const char* git_rev_list[] = { git,    "rev-list", "-n",      "1",
                                 "HEAD", "--",       CM_NULLPTR };
  std::string rev;
  OneLineParser out(this, "rl-out> ", rev);
  OutputLogger err(this->Log, "rl-err> ");
  this->RunChild(git_rev_list, &out, &err);
  return rev;
}